

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::write_ptr<char,std::back_insert_iterator<std::__cxx11::string>,unsigned_long>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,unsigned_long value,basic_format_specs<char> *specs)

{
  int value_00;
  type tVar1;
  checked_ptr<typename_basic_string<char>::value_type> it;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_30;
  
  value_00 = count_digits<4u,unsigned_long>(value);
  tVar1 = to_unsigned<int>(value_00);
  local_30.value = value;
  local_30.num_digits = value_00;
  if (specs == (basic_format_specs<char> *)0x0) {
    it = reserve<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                   (out,(ulong)tVar1 + 2);
    write_ptr<char,_std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_long>
    ::anon_class_16_2_92d121e5::operator()(&local_30,it);
  }
  else {
    out = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_ptr<char,std::back_insert_iterator<std::__cxx11::string>,unsigned_long>(std::back_insert_iterator<std::__cxx11::string>,unsigned_long,fmt::v7::basic_format_specs<char>const*)::_lambda(char*)_1_>
                    (out,specs,(ulong)tVar1 + 2,&local_30);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}